

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

bool __thiscall Time::Time::fromDate(Time *this,char *_date)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  int left;
  String *pSVar5;
  long lVar6;
  undefined **ppuVar7;
  String remain;
  String date;
  String monthTxt_1;
  String monthTxt;
  String SStack_128;
  String local_118;
  String local_108;
  String local_f8;
  String local_e8;
  String local_d8;
  String local_c8;
  String local_b8;
  String local_a8;
  String local_98;
  tm local_88;
  String local_50;
  String local_40;
  
  Bstrlib::String::String(&local_108,_date);
  local_88.tm_isdst = 0;
  local_88._36_4_ = 0;
  local_88.tm_gmtoff = 0;
  local_88.tm_mon = 0;
  local_88.tm_year = 0;
  local_88.tm_wday = 0;
  local_88.tm_yday = 0;
  local_88.tm_sec = 0;
  local_88.tm_min = 0;
  local_88.tm_hour = 0;
  local_88.tm_mday = 0;
  local_88.tm_zone = (char *)0x0;
  iVar2 = Bstrlib::String::Find(&local_108,"T",0);
  if (iVar2 < 8) {
    bVar1 = false;
  }
  else {
    Bstrlib::String::String(&local_50,"T");
    Bstrlib::String::fromFirst(&local_40,&local_108,SUB81(&local_50,0));
    bVar1 = 6 < local_40.super_tagbstring.slen;
    Bstrlib::String::~String(&local_40);
    Bstrlib::String::~String(&local_50);
  }
  if (bVar1) {
    Bstrlib::String::findAndReplace(&local_108,"-","",0);
    Bstrlib::String::findAndReplace(&local_108,"-","",0);
    Bstrlib::String::findAndReplace(&local_108,"-","",0);
    Bstrlib::String::findAndReplace(&local_108,":","",0);
    Bstrlib::String::findAndReplace(&local_108,":","",0);
    Bstrlib::String::findAndReplace(&local_108,":","",0);
    Bstrlib::String::midString(&SStack_128,(int)&local_108,0);
    iVar2 = Bstrlib::String::operator_cast_to_int(&SStack_128);
    local_88.tm_year = iVar2 + -0x76c;
    Bstrlib::String::~String(&SStack_128);
    Bstrlib::String::midString(&SStack_128,(int)&local_108,4);
    iVar2 = Bstrlib::String::operator_cast_to_int(&SStack_128);
    local_88.tm_mon = iVar2 + -1;
    Bstrlib::String::~String(&SStack_128);
    Bstrlib::String::midString(&SStack_128,(int)&local_108,6);
    iVar2 = Bstrlib::String::operator_cast_to_int(&SStack_128);
    local_88.tm_mday = iVar2;
    Bstrlib::String::~String(&SStack_128);
    Bstrlib::String::midString(&SStack_128,(int)&local_108,9);
    local_88.tm_hour = Bstrlib::String::operator_cast_to_int(&SStack_128);
    Bstrlib::String::~String(&SStack_128);
    Bstrlib::String::midString(&SStack_128,(int)&local_108,0xb);
    iVar2 = Bstrlib::String::operator_cast_to_int(&SStack_128);
    local_88.tm_min = iVar2;
    Bstrlib::String::~String(&SStack_128);
    Bstrlib::String::midString(&SStack_128,(int)&local_108,0xd);
    local_88.tm_sec = Bstrlib::String::operator_cast_to_int(&SStack_128);
LAB_0011666e:
    Bstrlib::String::~String(&SStack_128);
    tVar4 = timeGM(&local_88);
    (this->timeSinceEpoch).tv_sec = tVar4;
    (this->timeSinceEpoch).tv_usec = 0;
    bVar1 = true;
  }
  else {
    iVar2 = Bstrlib::String::Find(&local_108,',',0);
    left = (int)&SStack_128;
    if (iVar2 == -1) {
      Bstrlib::String::String(&local_f8," ");
      Bstrlib::String::fromFirst(&SStack_128,&local_108,SUB81(&local_f8,0));
      Bstrlib::String::~String(&local_f8);
      Bstrlib::String::midString(&local_f8,left,0);
      ppuVar7 = &PTR_anon_var_dwarf_21b7b_00131500;
      lVar6 = 0;
      do {
        bVar1 = Bstrlib::String::operator!=(&local_f8,*ppuVar7);
        if (!bVar1) goto LAB_001162f1;
        lVar6 = lVar6 + 1;
        ppuVar7 = ppuVar7 + 1;
      } while (lVar6 != 0xc);
      lVar6 = 0xc;
LAB_001162f1:
      local_88.tm_mon = (int)lVar6;
      if ((int)lVar6 != 0xc) {
        Bstrlib::String::midString(&local_118,left,4);
        iVar2 = Bstrlib::String::operator_cast_to_int(&local_118);
        local_88.tm_mday = iVar2;
        Bstrlib::String::~String(&local_118);
        Bstrlib::String::midString(&local_118,left,7);
        local_88.tm_hour = Bstrlib::String::operator_cast_to_int(&local_118);
        Bstrlib::String::~String(&local_118);
        Bstrlib::String::midString(&local_118,left,10);
        iVar2 = Bstrlib::String::operator_cast_to_int(&local_118);
        local_88.tm_min = iVar2;
        Bstrlib::String::~String(&local_118);
        Bstrlib::String::midString(&local_118,left,0xd);
        local_88.tm_sec = Bstrlib::String::operator_cast_to_int(&local_118);
        Bstrlib::String::~String(&local_118);
        Bstrlib::String::midString(&local_118,left,0x10);
        iVar2 = Bstrlib::String::operator_cast_to_int(&local_118);
        local_88.tm_year = iVar2 + -0x76c;
        Bstrlib::String::~String(&local_118);
        pSVar5 = &local_f8;
        goto LAB_00116669;
      }
      pSVar5 = &local_f8;
    }
    else {
      Bstrlib::String::String(&local_f8," ");
      Bstrlib::String::fromFirst(&SStack_128,&local_108,SUB81(&local_f8,0));
      Bstrlib::String::~String(&local_f8);
      iVar2 = Bstrlib::String::Find(&SStack_128,'-',0);
      if (iVar2 == -1) {
        Bstrlib::String::String(&local_a8," ");
        Bstrlib::String::fromFirst(&local_98,&SStack_128,SUB81(&local_a8,0));
        Bstrlib::String::String(&local_b8," ");
        Bstrlib::String::fromFirst(&local_118,&local_98,SUB81(&local_b8,0));
        Bstrlib::String::String(&local_c8," ");
        Bstrlib::String::upToFirst(&local_f8,&local_118,SUB81(&local_c8,0));
      }
      else {
        Bstrlib::String::String(&local_a8,"-");
        Bstrlib::String::fromFirst(&local_98,&SStack_128,SUB81(&local_a8,0));
        Bstrlib::String::String(&local_b8,"-");
        Bstrlib::String::fromFirst(&local_118,&local_98,SUB81(&local_b8,0));
        Bstrlib::String::String(&local_c8," ");
        Bstrlib::String::upToFirst(&local_f8,&local_118,SUB81(&local_c8,0));
      }
      Bstrlib::String::~String(&local_f8);
      Bstrlib::String::~String(&local_c8);
      Bstrlib::String::~String(&local_118);
      Bstrlib::String::~String(&local_b8);
      Bstrlib::String::~String(&local_98);
      Bstrlib::String::~String(&local_a8);
      Bstrlib::String::midString(&local_d8,left,0);
      iVar2 = Bstrlib::String::operator_cast_to_int(&local_d8);
      local_88.tm_mday = iVar2;
      Bstrlib::String::~String(&local_d8);
      Bstrlib::String::midString(&local_d8,left,3);
      ppuVar7 = &PTR_anon_var_dwarf_21b7b_00131500;
      lVar6 = 0;
      do {
        bVar1 = Bstrlib::String::operator!=(&local_d8,*ppuVar7);
        if (!bVar1) goto LAB_0011644c;
        lVar6 = lVar6 + 1;
        ppuVar7 = ppuVar7 + 1;
      } while (lVar6 != 0xc);
      lVar6 = 0xc;
LAB_0011644c:
      local_88.tm_mon = (int)lVar6;
      if ((int)lVar6 != 0xc) {
        Bstrlib::String::midString(&local_e8,left,7);
        iVar2 = Bstrlib::String::operator_cast_to_int(&local_e8);
        local_88.tm_year = iVar2;
        Bstrlib::String::~String(&local_e8);
        iVar3 = -0x76c;
        if ((0x76c < iVar2) || (iVar3 = 100, iVar2 < 0x46)) {
          local_88.tm_year = iVar2 + iVar3;
        }
        Bstrlib::String::midString(&local_e8,left,local_f8.super_tagbstring.slen + 8);
        iVar2 = Bstrlib::String::operator_cast_to_int(&local_e8);
        local_88.tm_hour = iVar2;
        Bstrlib::String::~String(&local_e8);
        Bstrlib::String::midString(&local_e8,left,local_f8.super_tagbstring.slen + 0xb);
        iVar2 = Bstrlib::String::operator_cast_to_int(&local_e8);
        local_88.tm_min = iVar2;
        Bstrlib::String::~String(&local_e8);
        Bstrlib::String::midString(&local_e8,left,local_f8.super_tagbstring.slen + 0xe);
        local_88.tm_sec = Bstrlib::String::operator_cast_to_int(&local_e8);
        Bstrlib::String::~String(&local_e8);
        pSVar5 = &local_d8;
LAB_00116669:
        Bstrlib::String::~String(pSVar5);
        goto LAB_0011666e;
      }
      pSVar5 = &local_d8;
    }
    Bstrlib::String::~String(pSVar5);
    Bstrlib::String::~String(&SStack_128);
    bVar1 = false;
  }
  Bstrlib::String::~String(&local_108);
  return bVar1;
}

Assistant:

bool Time::fromDate(const char * _date)
    {
#if defined(_WIN32) || defined(_POSIX)
        typedef Strings::FastString String;
        String date(_date);
        struct tm ekT = {0};

        const char * monthName[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
        
        // Check for ISO8601 format first
        if (date.Find("T") >= 8 && date.fromFirst("T").getLength() > 6)
        {
            // Both format YYYY-MM-DDTHH:MM:SS and YYYYMMDDTHHMMSS exists and are valid
            date.findAndReplace("-", ""); date.findAndReplace("-", ""); date.findAndReplace("-", "");
            date.findAndReplace(":", ""); date.findAndReplace(":", ""); date.findAndReplace(":", "");
            
            ekT.tm_year = (int)date.midString(0, 4) - 1900;
            ekT.tm_mon = (int)date.midString(4, 2) - 1; // Month are in [0 11] range
            ekT.tm_mday = (int)date.midString(6, 2);
            ekT.tm_hour = (int)date.midString(9, 2);
            ekT.tm_min = (int)date.midString(11, 2);
            ekT.tm_sec = (int)date.midString(13, 2);
        } 
        // Try to figure out the format used (RFC1036 or RFC1123 or asctime)
        else if (date.Find(',') == -1)
        {
            // Probably asctime, so let's figure out the format now
            String remain = date.fromFirst(" ");
            String monthTxt = remain.midString(0, 3);

            for (ekT.tm_mon = 0; ekT.tm_mon < 12 && monthTxt != monthName[ekT.tm_mon]; ekT.tm_mon++);
            if (ekT.tm_mon == 12) return false;

            ekT.tm_mday = (int)remain.midString(4, 2);
            ekT.tm_hour = (int)remain.midString(7, 2);
            ekT.tm_min  = (int)remain.midString(10, 2);
            ekT.tm_sec  = (int)remain.midString(13, 2);
            ekT.tm_year = (int)remain.midString(16, 4) - 1900;
        }
        else
        {   // Either RFC 1123 or RFC 1036
            String remain = date.fromFirst(" ");
            int yearLength = remain.Find('-') != -1 ? 
                                    remain.fromFirst("-").fromFirst("-").upToFirst(" ").getLength()
                                 :  remain.fromFirst(" ").fromFirst(" ").upToFirst(" ").getLength();
            ekT.tm_mday = (int)remain.midString(0, 2);
            String monthTxt = remain.midString(3, 3);

            for (ekT.tm_mon = 0; ekT.tm_mon < 12 && monthTxt != monthName[ekT.tm_mon]; ekT.tm_mon++);
            if (ekT.tm_mon == 12) return false;

            ekT.tm_year = (int)remain.midString(7, yearLength); 
            if (ekT.tm_year > 1900) ekT.tm_year -= 1900; else if (ekT.tm_year < 70) ekT.tm_year += 100;
            ekT.tm_hour = (int)remain.midString(8 + yearLength, 2);
            ekT.tm_min  = (int)remain.midString(11 + yearLength, 2);
            ekT.tm_sec  = (int)remain.midString(14 + yearLength, 2);
        }

        timeSinceEpoch.tv_sec = timeGM(&ekT);
        timeSinceEpoch.tv_usec = 0;
        return true;
#else        
        return false;
#endif
    }